

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
glcts::anon_unknown_0::BasicBuiltinVariables::RunIteration
          (BasicBuiltinVariables *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  bool bVar1;
  GLuint GVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  GLuint GVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  reference data_00;
  uint *puVar14;
  Vector<unsigned_int,_4> local_198;
  Vector<unsigned_int,_4> local_188;
  uint local_178;
  undefined1 local_174 [4];
  GLuint expected_3;
  uvec3 coord;
  GLuint index_5;
  Vector<unsigned_int,_4> local_154;
  undefined1 local_144 [8];
  uvec3 expected_2;
  GLuint index_4;
  Vector<unsigned_int,_4> local_124;
  undefined1 local_114 [8];
  uvec3 expected_1;
  GLuint index_3;
  Vector<unsigned_int,_4> local_f4;
  undefined1 local_e4 [8];
  uvec3 expected;
  GLuint index_2;
  Vector<unsigned_int,_4> local_c4;
  uint local_b4;
  undefined4 local_b0;
  GLuint index_1;
  Vector<unsigned_int,_4> local_9c;
  uint local_8c;
  void *pvStack_88;
  GLuint index;
  uvec4 *result;
  undefined1 local_78 [8];
  vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> data;
  GLuint kBufferSize;
  string local_50;
  byte local_29;
  uvec3 *puStack_28;
  bool dispatch_indirect_local;
  uvec3 *num_groups_local;
  uvec3 *local_size_local;
  BasicBuiltinVariables *this_local;
  
  local_29 = dispatch_indirect;
  puStack_28 = num_groups;
  num_groups_local = param_1;
  local_size_local = (uvec3 *)this;
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  glcts::(anonymous_namespace)::BasicBuiltinVariables::GenSource_abi_cxx11_
            (&local_50,this,num_groups_local,puStack_28);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_50);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&local_50);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,(bool *)0x0);
  if (bVar1) {
    uVar3 = tcu::Vector<unsigned_int,_3>::x(num_groups_local);
    uVar4 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
    uVar5 = tcu::Vector<unsigned_int,_3>::y(num_groups_local);
    uVar6 = tcu::Vector<unsigned_int,_3>::y(puStack_28);
    uVar7 = tcu::Vector<unsigned_int,_3>::z(num_groups_local);
    uVar8 = tcu::Vector<unsigned_int,_3>::z(puStack_28);
    data.
    super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         uVar3 * uVar4 * uVar5 * uVar6 * uVar7 * uVar8;
    uVar3 = (uint)data.
                  super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage * 6;
    std::allocator<tcu::Vector<unsigned_int,_4>_>::allocator
              ((allocator<tcu::Vector<unsigned_int,_4>_> *)((long)&result + 7));
    std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
    vector((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> *)
           local_78,(ulong)uVar3,(allocator<tcu::Vector<unsigned_int,_4>_> *)((long)&result + 7));
    std::allocator<tcu::Vector<unsigned_int,_4>_>::~allocator
              ((allocator<tcu::Vector<unsigned_int,_4>_> *)((long)&result + 7));
    if (this->m_storage_buffer == 0) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_storage_buffer);
    }
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,this->m_storage_buffer);
    uVar13 = (ulong)(uint)data.
                          super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    data_00 = std::
              vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
              operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                          *)local_78,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,uVar13 * 0x60,data_00,0x88e8);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    if ((local_29 & 1) == 0) {
      uVar3 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
      uVar4 = tcu::Vector<unsigned_int,_3>::y(puStack_28);
      uVar5 = tcu::Vector<unsigned_int,_3>::z(puStack_28);
      glu::CallLogWrapper::glDispatchCompute
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,uVar3,uVar4,uVar5);
    }
    else {
      if (this->m_dispatch_buffer == 0) {
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_dispatch_buffer);
      }
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90ee,this->m_dispatch_buffer);
      puVar14 = tcu::Vector<unsigned_int,_3>::operator[](puStack_28,0);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90ee,0xc,puVar14,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0);
    }
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_storage_buffer);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x200);
    pvStack_88 = glu::CallLogWrapper::glMapBufferRange
                           (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                             super_CallLogWrapper,0x90d2,0,
                            (ulong)(uint)data.
                                         super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage * 0x60,1
                           );
    for (local_8c = 0;
        local_8c <
        (uint)data.
              super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage; local_8c = local_8c + 1) {
      tcu::Vector<unsigned_int,_4>::Vector
                (&local_9c,(Vector<unsigned_int,_4> *)((long)pvStack_88 + (ulong)local_8c * 0x10));
      uVar3 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
      uVar4 = tcu::Vector<unsigned_int,_3>::y(puStack_28);
      uVar5 = tcu::Vector<unsigned_int,_3>::z(puStack_28);
      tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&index_1,uVar3,uVar4,uVar5,0);
      bVar1 = ComputeShaderBase::IsEqual(&this->super_ComputeShaderBase,&local_9c,(uvec4 *)&index_1)
      ;
      if (!bVar1) {
        anon_unknown_0::Output("gl_NumWorkGroups: Invalid data at index %d.\n",(ulong)local_8c);
        this_local._7_1_ = 0;
        goto LAB_01422fed;
      }
    }
    for (local_b4 = (uint)data.
                          super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_b4 <
        (uint)data.
              super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage << 1; local_b4 = local_b4 + 1) {
      tcu::Vector<unsigned_int,_4>::Vector
                (&local_c4,(Vector<unsigned_int,_4> *)((long)pvStack_88 + (ulong)local_b4 * 0x10));
      uVar3 = tcu::Vector<unsigned_int,_3>::x(num_groups_local);
      uVar4 = tcu::Vector<unsigned_int,_3>::y(num_groups_local);
      uVar5 = tcu::Vector<unsigned_int,_3>::z(num_groups_local);
      tcu::Vector<unsigned_int,_4>::Vector
                ((Vector<unsigned_int,_4> *)(expected.m_data + 2),uVar3,uVar4,uVar5,0);
      bVar1 = ComputeShaderBase::IsEqual
                        (&this->super_ComputeShaderBase,&local_c4,(uvec4 *)(expected.m_data + 2));
      if (!bVar1) {
        anon_unknown_0::Output("gl_WorkGroupSize: Invalid data at index %d.\n",(ulong)local_b4);
        this_local._7_1_ = 0;
        goto LAB_01422fed;
      }
    }
    for (expected.m_data[1] =
              (uint)data.
                    super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage << 1; GVar2 = (GLuint)this,
        expected.m_data[1] <
        (uint)data.
              super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage * 3;
        expected.m_data[1] = expected.m_data[1] + 1) {
      GVar9 = expected.m_data[1] +
              (uint)data.
                    super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage * -2;
      uVar3 = tcu::Vector<unsigned_int,_3>::x(num_groups_local);
      uVar4 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
      tcu::Vector<unsigned_int,_3>::y(num_groups_local);
      tcu::Vector<unsigned_int,_3>::y(puStack_28);
      ComputeShaderBase::IndexTo3DCoord((ComputeShaderBase *)local_e4,GVar2,GVar9,uVar3 * uVar4);
      uVar3 = tcu::Vector<unsigned_int,_3>::x(num_groups_local);
      puVar14 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)local_e4);
      *puVar14 = *puVar14 / uVar3;
      uVar3 = tcu::Vector<unsigned_int,_3>::y(num_groups_local);
      puVar14 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)local_e4);
      *puVar14 = *puVar14 / uVar3;
      uVar3 = tcu::Vector<unsigned_int,_3>::z(num_groups_local);
      puVar14 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)local_e4);
      *puVar14 = *puVar14 / uVar3;
      tcu::Vector<unsigned_int,_4>::Vector
                (&local_f4,
                 (Vector<unsigned_int,_4> *)((long)pvStack_88 + (ulong)expected.m_data[1] * 0x10));
      puVar14 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)local_e4);
      uVar3 = *puVar14;
      puVar14 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)local_e4);
      uVar4 = *puVar14;
      puVar14 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)local_e4);
      tcu::Vector<unsigned_int,_4>::Vector
                ((Vector<unsigned_int,_4> *)(expected_1.m_data + 2),uVar3,uVar4,*puVar14,0);
      bVar1 = ComputeShaderBase::IsEqual
                        (&this->super_ComputeShaderBase,&local_f4,(uvec4 *)(expected_1.m_data + 2));
      if (!bVar1) {
        anon_unknown_0::Output
                  ("gl_WorkGroupID: Invalid data at index %d.\n",(ulong)expected.m_data[1]);
        this_local._7_1_ = 0;
        goto LAB_01422fed;
      }
    }
    for (expected_1.m_data[1] =
              (uint)data.
                    super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage * 3;
        expected_1.m_data[1] <
        (uint)data.
              super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage << 2;
        expected_1.m_data[1] = expected_1.m_data[1] + 1) {
      GVar9 = expected_1.m_data[1] +
              (uint)data.
                    super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage * -3;
      uVar3 = tcu::Vector<unsigned_int,_3>::x(num_groups_local);
      uVar4 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
      tcu::Vector<unsigned_int,_3>::y(num_groups_local);
      tcu::Vector<unsigned_int,_3>::y(puStack_28);
      ComputeShaderBase::IndexTo3DCoord((ComputeShaderBase *)local_114,GVar2,GVar9,uVar3 * uVar4);
      uVar3 = tcu::Vector<unsigned_int,_3>::x(num_groups_local);
      puVar14 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)local_114);
      *puVar14 = *puVar14 % uVar3;
      uVar3 = tcu::Vector<unsigned_int,_3>::y(num_groups_local);
      puVar14 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)local_114);
      *puVar14 = *puVar14 % uVar3;
      uVar3 = tcu::Vector<unsigned_int,_3>::z(num_groups_local);
      puVar14 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)local_114);
      *puVar14 = *puVar14 % uVar3;
      tcu::Vector<unsigned_int,_4>::Vector
                (&local_124,
                 (Vector<unsigned_int,_4> *)((long)pvStack_88 + (ulong)expected_1.m_data[1] * 0x10))
      ;
      puVar14 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)local_114);
      uVar3 = *puVar14;
      puVar14 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)local_114);
      uVar4 = *puVar14;
      puVar14 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)local_114);
      tcu::Vector<unsigned_int,_4>::Vector
                ((Vector<unsigned_int,_4> *)(expected_2.m_data + 2),uVar3,uVar4,*puVar14,0);
      bVar1 = ComputeShaderBase::IsEqual
                        (&this->super_ComputeShaderBase,&local_124,(uvec4 *)(expected_2.m_data + 2))
      ;
      if (!bVar1) {
        anon_unknown_0::Output
                  ("gl_LocalInvocationID: Invalid data at index %d.\n",(ulong)expected_1.m_data[1]);
        this_local._7_1_ = 0;
        goto LAB_01422fed;
      }
    }
    for (expected_2.m_data[1] =
              (uint)data.
                    super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage << 2;
        expected_2.m_data[1] <
        (uint)data.
              super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage * 5;
        expected_2.m_data[1] = expected_2.m_data[1] + 1) {
      GVar9 = expected_2.m_data[1] +
              (uint)data.
                    super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage * -4;
      uVar3 = tcu::Vector<unsigned_int,_3>::x(num_groups_local);
      uVar4 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
      tcu::Vector<unsigned_int,_3>::y(num_groups_local);
      tcu::Vector<unsigned_int,_3>::y(puStack_28);
      ComputeShaderBase::IndexTo3DCoord((ComputeShaderBase *)local_144,GVar2,GVar9,uVar3 * uVar4);
      tcu::Vector<unsigned_int,_4>::Vector
                (&local_154,
                 (Vector<unsigned_int,_4> *)((long)pvStack_88 + (ulong)expected_2.m_data[1] * 0x10))
      ;
      puVar14 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)local_144);
      uVar3 = *puVar14;
      puVar14 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)local_144);
      uVar4 = *puVar14;
      puVar14 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)local_144);
      tcu::Vector<unsigned_int,_4>::Vector
                ((Vector<unsigned_int,_4> *)(coord.m_data + 2),uVar3,uVar4,*puVar14,0);
      bVar1 = ComputeShaderBase::IsEqual
                        (&this->super_ComputeShaderBase,&local_154,(uvec4 *)(coord.m_data + 2));
      if (!bVar1) {
        anon_unknown_0::Output
                  ("gl_GlobalInvocationID: Invalid data at index %d.\n",(ulong)expected_2.m_data[1])
        ;
        this_local._7_1_ = 0;
        goto LAB_01422fed;
      }
    }
    for (coord.m_data[1] =
              (uint)data.
                    super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage * 5;
        coord.m_data[1] <
        (uint)data.
              super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage * 6;
        coord.m_data[1] = coord.m_data[1] + 1) {
      GVar9 = coord.m_data[1] +
              (uint)data.
                    super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage * -5;
      uVar3 = tcu::Vector<unsigned_int,_3>::x(num_groups_local);
      uVar4 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
      tcu::Vector<unsigned_int,_3>::y(num_groups_local);
      tcu::Vector<unsigned_int,_3>::y(puStack_28);
      ComputeShaderBase::IndexTo3DCoord((ComputeShaderBase *)local_174,GVar2,GVar9,uVar3 * uVar4);
      puVar14 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)local_174);
      uVar3 = *puVar14;
      uVar6 = tcu::Vector<unsigned_int,_3>::x(num_groups_local);
      puVar14 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)local_174);
      uVar4 = *puVar14;
      uVar7 = tcu::Vector<unsigned_int,_3>::y(num_groups_local);
      uVar8 = tcu::Vector<unsigned_int,_3>::x(num_groups_local);
      puVar14 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)local_174);
      uVar5 = *puVar14;
      uVar10 = tcu::Vector<unsigned_int,_3>::z(num_groups_local);
      uVar11 = tcu::Vector<unsigned_int,_3>::x(num_groups_local);
      uVar12 = tcu::Vector<unsigned_int,_3>::y(num_groups_local);
      local_178 = uVar3 % uVar6 + (uVar4 % uVar7) * uVar8 + (uVar5 % uVar10) * uVar11 * uVar12;
      tcu::Vector<unsigned_int,_4>::Vector
                (&local_188,
                 (Vector<unsigned_int,_4> *)((long)pvStack_88 + (ulong)coord.m_data[1] * 0x10));
      tcu::Vector<unsigned_int,_4>::Vector(&local_198,local_178);
      bVar1 = ComputeShaderBase::IsEqual(&this->super_ComputeShaderBase,&local_188,&local_198);
      if (!bVar1) {
        anon_unknown_0::Output
                  ("gl_LocalInvocationIndex: Invalid data at index %d.\n",(ulong)coord.m_data[1]);
        this_local._7_1_ = 0;
        goto LAB_01422fed;
      }
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0);
    this_local._7_1_ = 1;
LAB_01422fed:
    local_b0 = 1;
    std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
    ~vector((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> *)
            local_78);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		const GLuint kBufferSize =
			local_size.x() * num_groups.x() * local_size.y() * num_groups.y() * local_size.z() * num_groups.z();

		std::vector<uvec4> data(kBufferSize * 6);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(uvec4) * kBufferSize * 6, &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		uvec4* result;
		result = static_cast<uvec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(uvec4) * kBufferSize * 6, GL_MAP_READ_BIT));

		// gl_NumWorkGroups
		for (GLuint index = 0; index < kBufferSize; ++index)
		{
			if (!IsEqual(result[index], uvec4(num_groups.x(), num_groups.y(), num_groups.z(), 0)))
			{
				Output("gl_NumWorkGroups: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_WorkGroupSize
		for (GLuint index = kBufferSize; index < 2 * kBufferSize; ++index)
		{
			if (!IsEqual(result[index], uvec4(local_size.x(), local_size.y(), local_size.z(), 0)))
			{
				Output("gl_WorkGroupSize: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_WorkGroupID
		for (GLuint index = 2 * kBufferSize; index < 3 * kBufferSize; ++index)
		{
			uvec3 expected = IndexTo3DCoord(index - 2 * kBufferSize, local_size.x() * num_groups.x(),
											local_size.y() * num_groups.y());
			expected.x() /= local_size.x();
			expected.y() /= local_size.y();
			expected.z() /= local_size.z();
			if (!IsEqual(result[index], uvec4(expected.x(), expected.y(), expected.z(), 0)))
			{
				Output("gl_WorkGroupID: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_LocalInvocationID
		for (GLuint index = 3 * kBufferSize; index < 4 * kBufferSize; ++index)
		{
			uvec3 expected = IndexTo3DCoord(index - 3 * kBufferSize, local_size.x() * num_groups.x(),
											local_size.y() * num_groups.y());
			expected.x() %= local_size.x();
			expected.y() %= local_size.y();
			expected.z() %= local_size.z();
			if (!IsEqual(result[index], uvec4(expected.x(), expected.y(), expected.z(), 0)))
			{
				Output("gl_LocalInvocationID: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_GlobalInvocationID
		for (GLuint index = 4 * kBufferSize; index < 5 * kBufferSize; ++index)
		{
			uvec3 expected = IndexTo3DCoord(index - 4 * kBufferSize, local_size.x() * num_groups.x(),
											local_size.y() * num_groups.y());
			if (!IsEqual(result[index], uvec4(expected.x(), expected.y(), expected.z(), 0)))
			{
				Output("gl_GlobalInvocationID: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_LocalInvocationIndex
		for (GLuint index = 5 * kBufferSize; index < 6 * kBufferSize; ++index)
		{
			uvec3 coord = IndexTo3DCoord(index - 5 * kBufferSize, local_size.x() * num_groups.x(),
										 local_size.y() * num_groups.y());
			const GLuint expected = (coord.x() % local_size.x()) + (coord.y() % local_size.y()) * local_size.x() +
									(coord.z() % local_size.z()) * local_size.x() * local_size.y();
			if (!IsEqual(result[index], uvec4(expected)))
			{
				Output("gl_LocalInvocationIndex: Invalid data at index %d.\n", index);
				return false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return true;
	}